

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_object.h
# Opt level: O2

void __thiscall CameraBase::saveFrame(CameraBase *this,Mat *frame_left,Mat *frame_right)

{
  FileStorage *pFVar1;
  string *psVar2;
  allocator local_4e9;
  _Vector_base<int,_std::allocator<int>_> local_4e8;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8 [16];
  FileStorage fsl;
  FileStorage fsr;
  char fileName [1024];
  
  if (this->m_saveFrames != false) {
    snprintf(fileName,0x400,"images/left_%d.png",(ulong)(uint)this->m_frameCount);
    std::__cxx11::string::string((string *)&fsl,fileName,(allocator *)&local_4c8);
    _fsr = 0x1010000;
    local_4e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cv::imwrite((string *)&fsl,(_InputArray *)&fsr,(vector *)&local_4e8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
    std::__cxx11::string::~string((string *)&fsl);
    snprintf(fileName,0x400,"images/right_%d.png",(ulong)(uint)this->m_frameCount);
    std::__cxx11::string::string((string *)&fsl,fileName,(allocator *)&local_4c8);
    _fsr = 0x1010000;
    local_4e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cv::imwrite((string *)&fsl,(_InputArray *)&fsr,(vector *)&local_4e8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
    std::__cxx11::string::~string((string *)&fsl);
    snprintf(fileName,0x400,"images/left_%d.yml",(ulong)(uint)this->m_frameCount);
    std::__cxx11::string::string((string *)&fsr,fileName,(allocator *)&local_4c8);
    local_4e8._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage &
                  0xffffffffffffff00);
    psVar2 = (string *)&fsr;
    cv::FileStorage::FileStorage(&fsl,psVar2,1,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&fsr);
    pFVar1 = cv::operator<<(&fsl,(char *)psVar2);
    cv::operator<<(pFVar1,frame_left);
    snprintf(fileName,0x400,"images/right_%d.yml",(ulong)(uint)this->m_frameCount);
    std::__cxx11::string::string((string *)&local_4e8,fileName,&local_4e9);
    local_4c8 = local_4b8;
    local_4c0 = 0;
    local_4b8[0] = 0;
    psVar2 = (string *)&local_4e8;
    cv::FileStorage::FileStorage(&fsr,psVar2,1,(string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    pFVar1 = cv::operator<<(&fsr,(char *)psVar2);
    cv::operator<<(pFVar1,frame_right);
    cv::FileStorage::~FileStorage(&fsr);
    cv::FileStorage::~FileStorage(&fsl);
  }
  return;
}

Assistant:

void    saveFrame (cv::Mat &frame_left, cv::Mat &frame_right) {
                if (false == m_saveFrames) return;
                char fileName[1024];
                snprintf (fileName, sizeof (fileName), "images/left_%d.png", m_frameCount);
                imwrite (fileName, frame_left);
                snprintf (fileName, sizeof (fileName), "images/right_%d.png", m_frameCount);
                imwrite (fileName, frame_right);
                {
                    snprintf (fileName, sizeof (fileName), "images/left_%d.yml", m_frameCount);
                    cv::FileStorage fsl (fileName, cv::FileStorage::WRITE);
                    fsl << "image" << frame_left;
                    snprintf (fileName, sizeof (fileName), "images/right_%d.yml", m_frameCount);
                    cv::FileStorage fsr (fileName, cv::FileStorage::WRITE);
                    fsr << "image" << frame_right;
                }
              }